

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O3

bool __thiscall
cmIfFunctionBlocker::ShouldRemove
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *param_2)

{
  cmListFileArgument *pcVar1;
  bool bVar2;
  int iVar3;
  cmListFileArgument *this_00;
  pointer r;
  
  iVar3 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endif");
  if (iVar3 == 0) {
    this_00 = (lff->Arguments).
              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar1 = (lff->Arguments).
             super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_00 == pcVar1) {
      return true;
    }
    r = (this->Args).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
        _M_impl.super__Vector_impl_data._M_start;
    if ((long)pcVar1 - (long)this_00 ==
        (long)(this->Args).
              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)r) {
      do {
        bVar2 = cmListFileArgument::operator==(this_00,r);
        if (!bVar2) {
          return bVar2;
        }
        this_00 = this_00 + 1;
        r = r + 1;
      } while (this_00 != pcVar1);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool cmIfFunctionBlocker::ShouldRemove(const cmListFileFunction& lff,
                                       cmMakefile&)
{
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endif")) {
    // if the endif has arguments, then make sure
    // they match the arguments of the matching if
    if (lff.Arguments.empty() || lff.Arguments == this->Args) {
      return true;
    }
  }

  return false;
}